

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

LRNLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_lrn(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0xb4) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xb4;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.lrn_ = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::LRNLayerParams>
                           (arena);
    (this->layer_).lrn_ = (LRNLayerParams *)LVar2;
  }
  return (LRNLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::LRNLayerParams* NeuralNetworkLayer::_internal_mutable_lrn() {
  if (!_internal_has_lrn()) {
    clear_layer();
    set_has_lrn();
    layer_.lrn_ = CreateMaybeMessage< ::CoreML::Specification::LRNLayerParams >(GetArenaForAllocation());
  }
  return layer_.lrn_;
}